

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<6144,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  size_type sVar2;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar3;
  uint in_ESI;
  int in_R8D;
  byte in_R9B;
  bool result;
  uint h;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  uint32_t *in_stack_fffffffffffffca8;
  undefined2 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb2;
  byte bVar4;
  undefined1 in_stack_fffffffffffffcb3;
  undefined3 uVar5;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 uVar6;
  int in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  pfHash in_stack_fffffffffffffcd0;
  undefined1 local_328 [195];
  uint8_t in_stack_fffffffffffffd9b;
  uint8_t in_stack_fffffffffffffd9c;
  uint8_t in_stack_fffffffffffffd9d;
  uint8_t in_stack_fffffffffffffd9e;
  uint8_t in_stack_fffffffffffffd9f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffda0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar3 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar3 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x1800,pcVar3,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12b80f);
  Blob<6144>::Blob((Blob<6144> *)local_328);
  memset(local_328,0,0x300);
  if ((local_d & 1) != 0) {
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)CONCAT44(in_stack_fffffffffffffcc4,in_ESI),
               (void *)CONCAT44(in_EDX,in_ECX),in_R8D,
               CONCAT13(in_stack_fffffffffffffcb3,
                        CONCAT12(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0)),
               in_stack_fffffffffffffca8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffcc4,in_ESI),
               (value_type_conflict1 *)CONCAT44(in_EDX,in_ECX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<6144>,unsigned_int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8,
             SUB41((uint)in_stack_fffffffffffffcc4 >> 0x18,0),(Blob<6144> *)CONCAT44(in_EDX,in_ECX),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_R8D,CONCAT13(in_stack_fffffffffffffcb3,
                                      CONCAT12(in_stack_fffffffffffffcb2,in_stack_fffffffffffffcb0))
                     ));
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
  printf("%d keys\n",sVar2 & 0xffffffff);
  uVar5 = (undefined3)in_stack_fffffffffffffcc4;
  bVar4 = 1;
  bVar1 = TestHashList<unsigned_int>
                    (in_stack_fffffffffffffda0,(bool)in_stack_fffffffffffffd9f,
                     (bool)in_stack_fffffffffffffd9e,(bool)in_stack_fffffffffffffd9d,
                     (bool)in_stack_fffffffffffffd9c,(bool)in_stack_fffffffffffffd9b);
  uVar6 = CONCAT13(bVar1 & bVar4,uVar5);
  printf("\n");
  bVar4 = (byte)((uint)uVar6 >> 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar6,in_ESI));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}